

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void CVmObjLookupTable::get_constructor_args
               (uint argc,size_t *bucket_count,size_t *init_capacity,vm_val_t *src_obj)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_val_t *pvVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  ulong uVar7;
  
  src_obj->typ = VM_NIL;
  if (argc == 2) {
    iVar6 = CVmBif::pop_long_val();
    *bucket_count = (long)iVar6;
    iVar6 = CVmBif::pop_long_val();
    *init_capacity = (long)iVar6;
  }
  else if (argc == 1) {
    pvVar2 = sp_ + -1;
    uVar3 = *(undefined4 *)&sp_[-1].field_0x4;
    aVar1 = sp_[-1].val;
    sp_ = sp_ + -1;
    src_obj->typ = pvVar2->typ;
    *(undefined4 *)&src_obj->field_0x4 = uVar3;
    src_obj->val = aVar1;
    iVar4 = vm_val_t::is_listlike(src_obj);
    if (iVar4 == 0) goto LAB_00268ccd;
    uVar5 = vm_val_t::ll_length(src_obj);
    if ((int)uVar5 < 0) goto LAB_00268ccd;
    uVar7 = (ulong)((uVar5 >> 1) + uVar5);
    *init_capacity = uVar7;
    *bucket_count = uVar7;
  }
  else {
    if (argc != 0) {
      err_throw(0x899);
    }
    *bucket_count = 0x20;
    *init_capacity = 0x40;
  }
  pvVar2 = sp_;
  uVar3 = *(undefined4 *)&src_obj->field_0x4;
  aVar1 = src_obj->val;
  sp_ = sp_ + 1;
  pvVar2->typ = src_obj->typ;
  *(undefined4 *)&pvVar2->field_0x4 = uVar3;
  pvVar2->val = aVar1;
  if ((*bucket_count != 0) && (*init_capacity != 0)) {
    return;
  }
LAB_00268ccd:
  err_throw(0x902);
}

Assistant:

void CVmObjLookupTable::get_constructor_args(VMG_ uint argc,
                                             size_t *bucket_count,
                                             size_t *init_capacity,
                                             vm_val_t *src_obj)
{
    /* presume no source object */
    src_obj->set_nil();

    /* check arguments */
    if (argc == 0)
    {
        /* no arguments - they want default parameters */
        *bucket_count = 32;
        *init_capacity = 64;
    }
    else if (argc == 1)
    {
        int cnt;
        
        /* 
         *   One argument - they want to create from a list.  Retrieve the
         *   list or vector object. 
         */
        G_stk->pop(src_obj);

        /* make sure it's a list or vector */
        if (!src_obj->is_listlike(vmg0_)
            || (cnt = src_obj->ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* use 1.5x the pair count as the bucket count and capacity */
        *bucket_count = *init_capacity = cnt*3 / 2;
    }
    else if (argc == 2)
    {
        /* 
         *   two arguments - they specified the bucket count and initial
         *   capacity; pop the parameters 
         */
        *bucket_count = (size_t)CVmBif::pop_long_val(vmg0_);
        *init_capacity = (size_t)CVmBif::pop_long_val(vmg0_);
    }
    else
    {
        /* invalid arguments */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }

    /* re-push the source object to protect it from gc */
    G_stk->push(src_obj);

    /* make sure both are positive */
    if (*bucket_count <= 0 || *init_capacity <= 0)
        err_throw(VMERR_BAD_VAL_BIF);
}